

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_circular(chunk_conflict *c,loc centre,wchar_t rating)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  wchar_t num;
  wchar_t wVar5;
  loc grid;
  loc local_34;
  loc offset;
  _Bool light;
  wchar_t radius;
  wchar_t rating_local;
  chunk_conflict *c_local;
  wchar_t wStack_10;
  loc centre_local;
  
  unique0x100001dc = centre;
  uVar3 = Rand_div(2);
  uVar4 = Rand_div(3);
  offset.y = uVar3 + uVar4 + 4;
  iVar1 = c->depth;
  uVar3 = Rand_div(0x19);
  offset.x._3_1_ = iVar1 <= (int)(uVar3 + 1);
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,offset.y * 2 + L'\n',offset.y * 2 + L'\n');
  if (((wStack_10 < c->height) && (c_local._4_4_ < c->width)) ||
     (_Var2 = find_space((loc *)((long)&c_local + 4),offset.y * 2 + L'\n',offset.y * 2 + L'\n'),
     _Var2)) {
    fill_circle(c,wStack_10,c_local._4_4_,offset.y + L'\x01',L'\0',L'\x01',L'\0',
                (_Bool)(offset.x._3_1_ & 1));
    set_bordering_walls(c,(wStack_10 - offset.y) + L'\xfffffffe',
                        (c_local._4_4_ - offset.y) + L'\xfffffffe',wStack_10 + offset.y + L'\x02',
                        c_local._4_4_ + offset.y + L'\x02');
    if ((0 < offset.y + -4) && (uVar3 = Rand_div(4), (int)uVar3 < offset.y + -4)) {
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"middle chamber");
      rand_dir(&local_34);
      draw_rectangle(c,wStack_10 + L'\xfffffffe',c_local._4_4_ + L'\xfffffffe',wStack_10 + L'\x02',
                     c_local._4_4_ + L'\x02',L'\x15',L'\v',false);
      grid = loc(c_local._4_4_ + local_34.x * 2,wStack_10 + local_34.y * 2);
      place_closed_door(c,grid);
      wVar5 = c->depth;
      num = Rand_div(2);
      vault_objects(c,stack0xffffffffffffffec,wVar5,num);
      iVar1 = c->depth;
      wVar5 = Rand_div(3);
      vault_monsters(c,stack0xffffffffffffffec,iVar1 + L'\x01',wVar5);
    }
    centre_local.x._3_1_ = true;
  }
  else {
    centre_local.x._3_1_ = false;
  }
  return centre_local.x._3_1_;
}

Assistant:

bool build_circular(struct chunk *c, struct loc centre, int rating)
{
	/* Pick a room size */
	int radius = 2 + randint1(2) + randint1(3);

	/* Occasional light */
	bool light = c->depth <= randint1(25) ? true : false;

	/* Find and reserve lots of space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
		2 * radius + 10, 2 * radius + 10);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, 2 * radius + 10, 2 * radius + 10))
			return (false);
	}

	/* Mark as a room. */
	fill_circle(c, centre.y, centre.x, radius + 1, 0, FEAT_FLOOR,
		SQUARE_NONE, light);

	/* Convert some floors to be the outer walls. */
	set_bordering_walls(c, centre.y - radius - 2, centre.x - radius - 2,
		centre.y + radius + 2, centre.x + radius + 2);

	/* Especially large circular rooms will have a middle chamber */
	if (radius - 4 > 0 && randint0(4) < radius - 4) {
		struct loc offset;

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"middle chamber");

		/* choose a random direction */
		rand_dir(&offset);

		/* draw a room with a closed door on a random side */
		draw_rectangle(c, centre.y - 2, centre.x - 2, centre.y + 2,
			centre.x + 2, FEAT_GRANITE, SQUARE_WALL_INNER, false);
		place_closed_door(c, loc(centre.x + offset.x * 2,
								 centre.y + offset.y * 2));

		/* Place a treasure in the vault */
		vault_objects(c, centre, c->depth, randint0(2));

		/* create some monsterss */
		vault_monsters(c, centre, c->depth + 1, randint0(3));
	}

	return true;
}